

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed.c
# Opt level: O3

void scale16(pced *out,int pow,int x)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  ulong local_88 [2];
  pced R;
  
  R.prod[0] = 0;
  R.prod[1] = 0;
  R.sum[3] = 0;
  R.sum[4] = 0;
  R.sum[1] = 0;
  R.sum[2] = 0;
  R.diff[4] = 0;
  R.sum[0] = 0;
  R.diff[2] = 0;
  R.diff[3] = 0;
  R.diff[0] = 0;
  R.diff[1] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  R.prod[2] = 0;
  iVar1 = 1 - ((uint)x >> 2 & 2);
  uVar2 = x * iVar1;
  lVar5 = 0;
  do {
    if (((uVar2 >> 2 | uVar2) & 3) == 0) {
      uVar8 = pced_zero.diff[lVar5];
      uVar3 = pced_zero.sum[lVar5];
      uVar6 = pced_zero.prod[lVar5];
    }
    else {
      uVar8 = 0;
      uVar3 = 0;
      uVar6 = 0;
    }
    local_88[lVar5] = local_88[lVar5] ^ uVar8;
    R.diff[lVar5 + 3] = R.diff[lVar5 + 3] ^ uVar3;
    R.sum[lVar5 + 3] = R.sum[lVar5 + 3] ^ uVar6;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  lVar5 = (long)(pow >> 1) * 0x3c0 + 0x1053e0;
  lVar4 = 0;
  do {
    uVar2 = uVar2 - 1;
    lVar7 = 0;
    do {
      if (((uVar2 >> 2 | uVar2) & 3) == 0) {
        uVar8 = *(ulong *)(lVar5 + -0x50 + lVar7 * 8);
        uVar3 = *(ulong *)(lVar5 + -0x28 + lVar7 * 8);
        uVar6 = *(ulong *)(lVar5 + lVar7 * 8);
      }
      else {
        uVar8 = 0;
        uVar3 = 0;
        uVar6 = 0;
      }
      local_88[lVar7] = local_88[lVar7] ^ uVar8;
      R.diff[lVar7 + 3] = R.diff[lVar7 + 3] ^ uVar3;
      R.sum[lVar7 + 3] = R.sum[lVar7 + 3] ^ uVar6;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 5);
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 0x78;
  } while (lVar4 != 8);
  lVar5 = 0;
  do {
    uVar8 = local_88[lVar5];
    uVar3 = R.diff[lVar5 + 3];
    bVar9 = ((uint)x >> 3 & 1) != 0;
    uVar6 = uVar8;
    if (bVar9) {
      uVar6 = uVar3;
    }
    out->diff[lVar5] = uVar6;
    if (bVar9) {
      uVar3 = uVar8;
    }
    out->sum[lVar5] = uVar3;
    out->prod[lVar5] = R.sum[lVar5 + 3] * (long)iVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void
scale16(struct pced *out, int pow, int x)
{
	struct pced R = { { 0 }, { 0 }, { 0 } };
	limb_t mA, mB, mask;
	int neg, sgnx, absx;
	int i, k;
	
	neg = (x >> 3) & 1;
	sgnx = 1 - 2*neg;
	absx = sgnx * x;
	pow >>= 1;

	/* handle abs(x) == 0 */
	mask = absx | (absx >> 2);
	mask |= mask >> 1;
	mask = (mask & 1) - 1;
	for (i = 0; i < FLD_LIMB_NUM; i++) {
		R.diff[i] ^= pced_zero.diff[i] & mask;
		R.sum[i] ^= pced_zero.sum[i] & mask;
		R.prod[i] ^= pced_zero.prod[i] & mask;
	}


	/* go through our table and look for abs(x) */
	for (k = 0; k < 8; k++) {
		absx--;
		mask = absx | (absx >> 2);
		mask |= mask >> 1;
		mask = (mask & 1) - 1;
		for (i = 0; i < FLD_LIMB_NUM; i++) {
			R.diff[i] ^= ed_lookup[pow][k].diff[i] & mask;
			R.sum[i] ^= ed_lookup[pow][k].sum[i] & mask;
			R.prod[i] ^= ed_lookup[pow][k].prod[i] & mask;
		}
	}

	/* conditionally negate R and write to out */
	mA = neg-1;
	mB = ~mA;
	for (i = 0; i < FLD_LIMB_NUM; i++) {
		out->diff[i] = (mA & R.diff[i]) ^ (mB & R.sum[i]);
		out->sum[i]  = (mB & R.diff[i]) ^ (mA & R.sum[i]);
		out->prod[i] = sgnx * R.prod[i];
	}
}